

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O3

result_type __thiscall
Well<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_Detail::M3<28>,_Detail::M1,_Detail::M3<18>,_Detail::M3<3>,_Detail::M3<21>,_Detail::M3<-17>,_Detail::M3<-28>,_Detail::M3<-1>,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_Detail::M3<28>,_Detail::M1,_Detail::M3<18>,_Detail::M3<3>,_Detail::M3<21>,_Detail::M3<_17>,_Detail::M3<_28>,_Detail::M3<_1>,_Detail::NoTempering>
             *this)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  sVar2 = this->index_;
  uVar7 = sVar2 + 0x2d5;
  if (uVar7 < 0x5ac) {
    uVar3 = sVar2 - 1;
    if (uVar7 < 0x2d6) {
      uVar3 = uVar7;
    }
    uVar7 = sVar2 + 0x2d4;
    if (uVar7 < 0x5ac) {
      uVar5 = sVar2 - 2;
      if (uVar7 < 0x2d6) {
        uVar5 = uVar7;
      }
      uVar7 = sVar2 + 0x29b;
      if ((uVar7 < 0x5ac) && (uVar1 = sVar2 + 0x2b, uVar1 < 0x5ac)) {
        uVar10 = sVar2 - 0x3b;
        if (uVar7 < 0x2d6) {
          uVar10 = uVar7;
        }
        uVar7 = sVar2 - 0x2ab;
        if (uVar1 < 0x2d6) {
          uVar7 = uVar1;
        }
        uVar8 = this->state_[sVar2] >> 0x1c ^ this->state_[uVar10] ^ this->state_[sVar2];
        uVar4 = this->state_[uVar5] & 0x7fffff | this->state_[uVar3] & 0xff800000;
        uVar5 = sVar2 - 0x108;
        if (sVar2 + 0x1ce < 0x2d6) {
          uVar5 = sVar2 + 0x1ce;
        }
        uVar6 = this->state_[uVar7] ^ this->state_[uVar5] ^
                this->state_[uVar5] >> 3 ^ this->state_[uVar7] >> 0x12;
        uVar9 = uVar6 ^ uVar8;
        uVar4 = uVar9 * 2 ^ uVar4 ^ uVar6 << 0x1c ^ (uVar8 << 0x11 | uVar4 >> 0x15);
        this->state_[sVar2] = uVar9;
        this->state_[uVar3] = uVar4;
        this->index_ = uVar3;
        return uVar4;
      }
    }
  }
  __assert_fail("value < 2 * r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sehe[P]well-random/well.hpp"
                ,0x9e,
                "static T Detail::Modulo<unsigned long, 726>::calc(T, std::false_type) [UIntType = unsigned long, r = 726, T = unsigned long]"
               );
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }